

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int combine_substitute(gen_ctx_t gen_ctx,bb_insn_t_conflict *bb_insn_ref,long *deleted_insns_num)

{
  undefined8 *puVar1;
  MIR_op_t *pMVar2;
  char cVar3;
  uint uVar4;
  MIR_insn_t_conflict before;
  VARR_MIR_reg_t *pVVar5;
  combine_ctx *pcVar6;
  VARR_size_t *pVVar7;
  VARR_MIR_op_t *pVVar8;
  MIR_op_t *pMVar9;
  MIR_disp_t MVar10;
  void *pvVar11;
  undefined8 uVar12;
  int64_t iVar13;
  char *pcVar14;
  undefined8 uVar15;
  MIR_insn_t pMVar16;
  MIR_insn_t pMVar17;
  void *pvVar18;
  int iVar19;
  int iVar20;
  MIR_insn_t pMVar21;
  MIR_op_t *pMVar22;
  size_t sVar23;
  long *plVar24;
  MIR_reg_t *pMVar25;
  MIR_reg_t MVar26;
  char *pcVar27;
  ulong uVar28;
  bb_insn_t_conflict bb_insn;
  bool bVar29;
  int out_p;
  long *local_b8;
  bb_insn_t_conflict local_b0;
  bb_insn_t_conflict *local_a8;
  MIR_op_t *local_a0;
  int local_94;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  MIR_context_t local_88;
  size_t local_80;
  MIR_reg_t *local_78;
  MIR_insn_t local_70;
  MIR_op_t saved_op;
  
  bb_insn = *bb_insn_ref;
  before = bb_insn->insn;
  uVar28 = *(ulong *)&before->field_0x18 >> 0x20;
  if (uVar28 == 0) {
    return 0;
  }
  local_88 = gen_ctx->ctx;
  local_b8 = deleted_insns_num;
  local_a8 = bb_insn_ref;
  VARR_MIR_op_ttrunc(gen_ctx->combine_ctx->last_right_ops,(size_t)bb_insn_ref);
  pMVar22 = before->ops;
  local_80 = uVar28;
  while( true ) {
    bVar29 = uVar28 == 0;
    uVar28 = uVar28 - 1;
    if (bVar29) break;
    VARR_MIR_op_tpush(gen_ctx->combine_ctx->last_right_ops,*pMVar22);
    pMVar22 = pMVar22 + 1;
  }
  local_a0 = before->ops;
  VARR_MIR_reg_ttrunc(gen_ctx->combine_ctx->insn_vars,(size_t)bb_insn_ref);
  bitmap_clear(gen_ctx->combine_ctx->vars_bitmap);
  pMVar25 = &before->ops[0].u.mem.index;
  for (sVar23 = 0; local_80 != sVar23; sVar23 = sVar23 + 1) {
    MIR_insn_op_mode(local_88,before,sVar23,&out_p);
    if ((out_p == 0) && (cVar3 = (char)pMVar25[-7], cVar3 != '\v')) {
      if (cVar3 == '\v') {
        if (pMVar25[-1] != 0xffffffff) {
          combine_process_var(gen_ctx,pMVar25[-1],bb_insn);
        }
        MVar26 = *pMVar25;
        if (MVar26 != 0xffffffff) goto LAB_00145503;
      }
      else if (cVar3 == '\x02') {
        MVar26 = *(MIR_reg_t *)(pMVar25 + -5);
LAB_00145503:
        combine_process_var(gen_ctx,MVar26,bb_insn);
      }
    }
    pMVar25 = pMVar25 + 0xc;
  }
  if ((((*(uint *)&before->field_0x18 & 0xfffffffc) == 0) &&
      (*(char *)&before[1].insn_link.prev == '\x02')) &&
     (sVar23 = VARR_MIR_reg_tlength(gen_ctx->combine_ctx->insn_vars), sVar23 != 0)) {
    pVVar5 = gen_ctx->combine_ctx->insn_vars;
    if (((pVVar5 == (VARR_MIR_reg_t *)0x0) || (pVVar5->varr == (MIR_reg_t *)0x0)) ||
       (pVVar5->els_num == 0)) {
      pcVar27 = "last";
      goto LAB_00145a81;
    }
    MVar26 = pVVar5->varr[pVVar5->els_num - 1];
    if (MVar26 == *(MIR_reg_t *)&before[1].insn_link.next) {
      pMVar21 = get_uptodate_def_insn(gen_ctx,MVar26);
      if (pMVar21 == (MIR_insn_t)0x0) {
        return 0;
      }
      uVar4 = *(uint *)&pMVar21->field_0x18;
      if (0xfffffffc < uVar4 - 0xaa) {
        return 0;
      }
      target_get_early_clobbered_hard_regs
                (pMVar21,&early_clobbered_hard_reg1,&early_clobbered_hard_reg2);
      if ((((3 < uVar4) && (early_clobbered_hard_reg1 == 0xffffffff)) &&
          ((early_clobbered_hard_reg2 == 0xffffffff &&
           ((*(char *)&before[1].insn_link.prev == '\x02' &&
            (*(MIR_reg_t *)&before[1].insn_link.next == MVar26)))))) &&
         ((before->ops[0].field_0x8 != '\v' ||
          ((before->ops[0].u.mem.base != MVar26 && (before->ops[0].u.mem.index != MVar26)))))) {
        saved_op.data = pMVar21->ops[0].data;
        saved_op._8_8_ = *(undefined8 *)&pMVar21->ops[0].field_0x8;
        saved_op.u.i = pMVar21->ops[0].u.i;
        saved_op.u.str.s = pMVar21->ops[0].u.str.s;
        saved_op.u._16_8_ = *(undefined8 *)((long)&pMVar21->ops[0].u + 0x10);
        saved_op.u.mem.disp = pMVar21->ops[0].u.mem.disp;
        pvVar11 = local_a0->data;
        uVar12 = *(undefined8 *)&local_a0->field_0x8;
        iVar13 = (local_a0->u).i;
        pcVar27 = (local_a0->u).str.s;
        pcVar14 = (local_a0->u).str.s;
        uVar15 = *(undefined8 *)((long)&local_a0->u + 0x10);
        MVar10 = (local_a0->u).mem.disp;
        pMVar21->ops[0].u.i = (local_a0->u).i;
        pMVar21->ops[0].u.str.s = pcVar14;
        *(undefined8 *)((long)&pMVar21->ops[0].u + 0x10) = uVar15;
        pMVar21->ops[0].u.mem.disp = MVar10;
        pMVar21->ops[0].data = pvVar11;
        *(undefined8 *)&pMVar21->ops[0].field_0x8 = uVar12;
        pMVar21->ops[0].u.i = iVar13;
        pMVar21->ops[0].u.str.s = pcVar27;
        iVar20 = target_insn_ok_p(gen_ctx,pMVar21);
        plVar24 = local_b8;
        pMVar21->ops[0].data = saved_op.data;
        *(undefined8 *)&pMVar21->ops[0].field_0x8 = saved_op._8_8_;
        pMVar21->ops[0].u.i = saved_op.u.i;
        pMVar21->ops[0].u.str.s = saved_op.u.str.s;
        pMVar21->ops[0].u.i = saved_op.u.i;
        pMVar21->ops[0].u.str.s = saved_op.u.str.s;
        *(undefined8 *)((long)&pMVar21->ops[0].u + 0x10) = saved_op.u._16_8_;
        pMVar21->ops[0].u.mem.disp = saved_op.u.mem.disp;
        if (iVar20 == 0) {
          return 0;
        }
        local_b0 = bb_insn;
        gen_move_insn_before(gen_ctx,before,pMVar21);
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          fwrite("      moving insn ",0x12,1,(FILE *)gen_ctx->debug_file);
          print_bb_insn(gen_ctx,(bb_insn_t_conflict)pMVar21->data,0);
          plVar24 = local_b8;
          fwrite("      before insn ",0x12,1,(FILE *)gen_ctx->debug_file);
          print_bb_insn(gen_ctx,local_b0,1);
        }
        pvVar11 = local_a0->data;
        uVar12 = *(undefined8 *)&local_a0->field_0x8;
        iVar13 = (local_a0->u).i;
        pcVar27 = (local_a0->u).str.s;
        pcVar14 = (local_a0->u).str.s;
        uVar15 = *(undefined8 *)((long)&local_a0->u + 0x10);
        MVar10 = (local_a0->u).mem.disp;
        pMVar21->ops[0].u.i = (local_a0->u).i;
        pMVar21->ops[0].u.str.s = pcVar14;
        *(undefined8 *)((long)&pMVar21->ops[0].u + 0x10) = uVar15;
        pMVar21->ops[0].u.mem.disp = MVar10;
        pMVar21->ops[0].data = pvVar11;
        *(undefined8 *)&pMVar21->ops[0].field_0x8 = uVar12;
        pMVar21->ops[0].u.i = iVar13;
        pMVar21->ops[0].u.str.s = pcVar27;
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          fwrite("      changing it to ",0x15,1,(FILE *)gen_ctx->debug_file);
          print_bb_insn(gen_ctx,(bb_insn_t_conflict)pMVar21->data,1);
          plVar24 = local_b8;
          fwrite("      deleting insn ",0x14,1,(FILE *)gen_ctx->debug_file);
          print_bb_insn(gen_ctx,local_b0,1);
        }
        gen_delete_insn(gen_ctx,before);
        *plVar24 = *plVar24 + 1;
        *local_a8 = (bb_insn_t_conflict)pMVar21->data;
        return 1;
      }
    }
  }
  local_78 = &before->ops[0].u.mem.index;
  iVar20 = 0;
  while( true ) {
    local_94 = iVar20;
    sVar23 = VARR_MIR_reg_tlength(gen_ctx->combine_ctx->insn_vars);
    if (sVar23 == 0) {
      return local_94;
    }
    pVVar5 = gen_ctx->combine_ctx->insn_vars;
    if (((pVVar5 == (VARR_MIR_reg_t *)0x0) || (pVVar5->varr == (MIR_reg_t *)0x0)) ||
       (sVar23 = pVVar5->els_num, sVar23 == 0)) break;
    pVVar5->els_num = sVar23 - 1;
    MVar26 = pVVar5->varr[sVar23 - 1];
    pMVar21 = get_uptodate_def_insn(gen_ctx,MVar26);
    iVar20 = local_94;
    if ((pMVar21 != (MIR_insn_t)0x0) && ((*(uint *)&pMVar21->field_0x18 & 0xfffffffc) == 0)) {
      local_70 = pMVar21 + 1;
      local_a8 = (bb_insn_t_conflict *)((ulong)local_a8 & 0xffffffff00000000);
      pMVar25 = local_78;
      local_b0 = bb_insn;
      for (sVar23 = 0; pMVar22 = local_a0, bb_insn = local_b0, local_80 != sVar23;
          sVar23 = sVar23 + 1) {
        MIR_insn_op_mode(local_88,before,sVar23,&out_p);
        if (((out_p == 0) && ((char)pMVar25[-7] == '\x02')) &&
           (*(MIR_reg_t *)(pMVar25 + -5) == MVar26)) {
          pvVar11 = local_70->data;
          pMVar16 = (local_70->insn_link).prev;
          pMVar17 = (local_70->insn_link).next;
          uVar12 = *(undefined8 *)&local_70->field_0x18;
          uVar15 = *(undefined8 *)&local_70->field_0x18;
          pvVar18 = local_70->ops[0].data;
          MVar10 = *(MIR_disp_t *)&local_70->ops[0].field_0x8;
          *(MIR_insn_t *)(pMVar25 + -5) = (local_70->insn_link).next;
          *(undefined8 *)(pMVar25 + -3) = uVar15;
          *(void **)(pMVar25 + -1) = pvVar18;
          *(MIR_disp_t *)(pMVar25 + 1) = MVar10;
          *(void **)(pMVar25 + -9) = pvVar11;
          *(MIR_insn_t *)(pMVar25 + -7) = pMVar16;
          *(MIR_insn_t *)(pMVar25 + -5) = pMVar17;
          *(undefined8 *)(pMVar25 + -3) = uVar12;
          VARR_size_tpush(gen_ctx->combine_ctx->changed_op_numbers,sVar23);
          local_a8 = (bb_insn_t_conflict *)CONCAT44(local_a8._4_4_,1);
        }
        else if (((char)pMVar25[-7] == '\v') && ((pMVar25[-1] == MVar26 || (*pMVar25 == MVar26)))) {
          __assert_fail("op_ref->mode != MIR_OP_VAR_MEM || (op_ref->u.var_mem.base != var && op_ref->u.var_mem.index != var)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x228a,"int combine_substitute(gen_ctx_t, bb_insn_t *, long *)");
        }
        pMVar25 = pMVar25 + 0xc;
      }
      iVar20 = local_94;
      if ((int)local_a8 != 0) {
        iVar19 = target_insn_ok_p(gen_ctx,before);
        while (sVar23 = VARR_size_tlength(gen_ctx->combine_ctx->changed_op_numbers), sVar23 != 0) {
          pcVar6 = gen_ctx->combine_ctx;
          pVVar7 = pcVar6->changed_op_numbers;
          if (((pVVar7 == (VARR_size_t *)0x0) || (pVVar7->varr == (size_t *)0x0)) ||
             (sVar23 = pVVar7->els_num, sVar23 == 0)) {
            mir_varr_assert_fail("pop","size_t");
          }
          pVVar7->els_num = sVar23 - 1;
          uVar28 = pVVar7->varr[sVar23 - 1];
          if (iVar19 == 0) {
            pVVar8 = pcVar6->last_right_ops;
            if (((pVVar8 == (VARR_MIR_op_t *)0x0) ||
                (pMVar9 = pVVar8->varr, pMVar9 == (MIR_op_t *)0x0)) || (pVVar8->els_num <= uVar28))
            {
              pcVar27 = "get";
              goto LAB_00145acf;
            }
            pMVar2 = pMVar9 + uVar28;
            pvVar11 = pMVar2->data;
            uVar12 = *(undefined8 *)&pMVar2->field_0x8;
            iVar13 = (pMVar2->u).i;
            pcVar27 = (pMVar2->u).str.s;
            pMVar2 = pMVar22 + uVar28;
            *(undefined8 *)((long)&pMVar2->u + 0x10) =
                 *(undefined8 *)((long)&pMVar9[uVar28].u + 0x10);
            MVar10 = pMVar9[uVar28].u.mem.disp;
            pMVar2->data = pvVar11;
            *(undefined8 *)&pMVar2->field_0x8 = uVar12;
            (pMVar2->u).i = iVar13;
            (pMVar2->u).str.s = pcVar27;
            (pMVar2->u).mem.disp = MVar10;
          }
          else {
            pVVar8 = pcVar6->last_right_ops;
            if (((pVVar8 == (VARR_MIR_op_t *)0x0) ||
                (pMVar9 = pVVar8->varr, pMVar9 == (MIR_op_t *)0x0)) || (pVVar8->els_num <= uVar28))
            {
              pcVar27 = "set";
LAB_00145acf:
              mir_varr_assert_fail(pcVar27,"MIR_op_t");
            }
            pMVar2 = pMVar22 + uVar28;
            pvVar11 = pMVar2->data;
            uVar12 = *(undefined8 *)&pMVar2->field_0x8;
            iVar13 = (pMVar2->u).i;
            pcVar27 = (pMVar2->u).str.s;
            MVar10 = (pMVar2->u).mem.disp;
            puVar1 = (undefined8 *)((long)&pMVar9[uVar28].u + 0x10);
            *puVar1 = *(undefined8 *)((long)&pMVar2->u + 0x10);
            puVar1[1] = MVar10;
            pMVar9 = pMVar9 + uVar28;
            pMVar9->data = pvVar11;
            *(undefined8 *)&pMVar9->field_0x8 = uVar12;
            (pMVar9->u).i = iVar13;
            (pMVar9->u).str.s = pcVar27;
          }
        }
        iVar20 = local_94;
        if (iVar19 != 0) {
          iVar20 = combine_delete_insn(gen_ctx,pMVar21,bb_insn);
          if (iVar20 != 0) {
            *local_b8 = *local_b8 + 1;
          }
          iVar20 = 1;
          if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (iVar20 = 1, 1 < gen_ctx->debug_level)
             ) {
            fwrite("      changing to ",0x12,1,(FILE *)gen_ctx->debug_file);
            print_bb_insn(gen_ctx,bb_insn,1);
            iVar20 = 1;
          }
        }
      }
    }
  }
  pcVar27 = "pop";
LAB_00145a81:
  mir_varr_assert_fail(pcVar27,"MIR_reg_t");
}

Assistant:

static int combine_substitute (gen_ctx_t gen_ctx, bb_insn_t *bb_insn_ref, long *deleted_insns_num) {
  MIR_context_t ctx = gen_ctx->ctx;
  bb_insn_t bb_insn = *bb_insn_ref;
  MIR_insn_t insn = bb_insn->insn, def_insn;
  size_t i, nops = insn->nops;
  int out_p, insn_change_p, insn_var_change_p, op_change_p, success_p;
  MIR_op_t *op_ref, saved_op;
  MIR_reg_t var, early_clobbered_hard_reg1, early_clobbered_hard_reg2;

  if (nops == 0) return FALSE;
  VARR_TRUNC (MIR_op_t, last_right_ops, 0);
  for (i = 0; i < nops; i++) VARR_PUSH (MIR_op_t, last_right_ops, insn->ops[i]);
  VARR_TRUNC (MIR_reg_t, insn_vars, 0);
  bitmap_clear (vars_bitmap);
  for (i = 0; i < nops; i++) {
    MIR_insn_op_mode (ctx, insn, i, &out_p);
    if (out_p || insn->ops[i].mode == MIR_OP_VAR_MEM) continue;
    combine_process_op (gen_ctx, &insn->ops[i], bb_insn);
  }

  if (move_code_p (insn->code) && insn->ops[1].mode == MIR_OP_VAR
      && VARR_LENGTH (MIR_reg_t, insn_vars) != 0
      && VARR_LAST (MIR_reg_t, insn_vars) == insn->ops[1].u.var) {
    /* We can change move src.  Try to change insn the following way:
       r0 = r2 op r3; ...; ... = r0  =>  ...; ... = r2 op r3 */
    var = insn->ops[1].u.var;
    if ((def_insn = get_uptodate_def_insn (gen_ctx, var)) == NULL
        || MIR_call_code_p (def_insn->code))
      return FALSE;
    target_get_early_clobbered_hard_regs (def_insn, &early_clobbered_hard_reg1,
                                          &early_clobbered_hard_reg2);
    if (!move_code_p (def_insn->code) && early_clobbered_hard_reg1 == MIR_NON_VAR
        && early_clobbered_hard_reg2 == MIR_NON_VAR && insn->ops[1].mode == MIR_OP_VAR
        && insn->ops[1].u.var == var
        /* Check that insn->ops[0] is not mem[...hr0...]: */
        && (insn->ops[0].mode != MIR_OP_VAR_MEM
            || (insn->ops[0].u.var_mem.base != var && insn->ops[0].u.var_mem.index != var))) {
      saved_op = def_insn->ops[0];
      def_insn->ops[0] = insn->ops[0];
      success_p = target_insn_ok_p (gen_ctx, def_insn);
      def_insn->ops[0] = saved_op;
      if (!success_p) return FALSE;
      gen_move_insn_before (gen_ctx, insn, def_insn);
      DEBUG (2, {
        fprintf (debug_file, "      moving insn ");
        print_bb_insn (gen_ctx, def_insn->data, FALSE);
        fprintf (debug_file, "      before insn ");
        print_bb_insn (gen_ctx, bb_insn, TRUE);
      });
      def_insn->ops[0] = insn->ops[0];
      DEBUG (2, {
        fprintf (debug_file, "      changing it to ");
        print_bb_insn (gen_ctx, def_insn->data, TRUE);
        fprintf (debug_file, "      deleting insn ");
        print_bb_insn (gen_ctx, bb_insn, TRUE);
      });
      gen_delete_insn (gen_ctx, insn);
      (*deleted_insns_num)++;
      *bb_insn_ref = def_insn->data;
      return TRUE;
    }
  }
  insn_change_p = FALSE;
  while (VARR_LENGTH (MIR_reg_t, insn_vars) != 0) {
    var = VARR_POP (MIR_reg_t, insn_vars);
    if ((def_insn = get_uptodate_def_insn (gen_ctx, var)) == NULL) continue;
    if (!move_code_p (def_insn->code)) continue;
    insn_var_change_p = FALSE;
    for (i = 0; i < nops; i++) { /* Change all var occurences: */
      op_ref = &insn->ops[i];
      op_change_p = FALSE;
      MIR_insn_op_mode (ctx, insn, i, &out_p);
      if (!out_p && op_ref->mode == MIR_OP_VAR && op_ref->u.var == var) {
        /* It is not safe to substitute if there is another use after def insn before
           the current as we delete def insn after substitution. */
        insn->ops[i] = def_insn->ops[1];
        insn_var_change_p = op_change_p = TRUE;
      } else {
        gen_assert (op_ref->mode != MIR_OP_VAR_MEM
                    || (op_ref->u.var_mem.base != var && op_ref->u.var_mem.index != var));
      }
      if (op_change_p) VARR_PUSH (size_t, changed_op_numbers, i);
    }
    if (insn_var_change_p) {
      if ((success_p = i >= nops && target_insn_ok_p (gen_ctx, insn))) insn_change_p = TRUE;
      while (VARR_LENGTH (size_t, changed_op_numbers)) {
        i = VARR_POP (size_t, changed_op_numbers);
        if (success_p)
          VARR_SET (MIR_op_t, last_right_ops, i, insn->ops[i]);
        else
          insn->ops[i] = VARR_GET (MIR_op_t, last_right_ops, i); /* restore changed operands */
      }
      if (success_p) {
        gen_assert (def_insn != NULL);
        if (combine_delete_insn (gen_ctx, def_insn, bb_insn)) (*deleted_insns_num)++;
        DEBUG (2, {
          fprintf (debug_file, "      changing to ");
          print_bb_insn (gen_ctx, bb_insn, TRUE);
        });
      }
    }
  }
  return insn_change_p;
}